

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O0

void UnitTest::CheckEqual<int,FIX::EncryptMethod>
               (TestResults *results,int *expected,EncryptMethod *actual,TestDetails *details)

{
  int iVar1;
  undefined8 test;
  int iVar2;
  ostream *poVar3;
  char *failure;
  undefined1 local_1c0 [8];
  MemoryOutStream stream;
  TestDetails *details_local;
  EncryptMethod *actual_local;
  int *expected_local;
  TestResults *results_local;
  
  iVar1 = *expected;
  stream._400_8_ = details;
  iVar2 = FIX::IntField::operator_cast_to_int(&actual->super_IntField);
  if (iVar1 != iVar2) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    poVar3 = std::operator<<((ostream *)local_1c0,"Expected ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*expected);
    poVar3 = std::operator<<(poVar3," but was ");
    FIX::operator<<(poVar3,(FieldBase *)actual);
    test = stream._400_8_;
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,(TestDetails *)test,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}